

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (CodedInputStream *input,RepeatedField<unsigned_int> *values)

{
  byte bVar1;
  uint8 *puVar2;
  byte *pbVar3;
  Limit limit;
  ulong uVar4;
  int iVar5;
  uint32 first_byte_or_zero;
  bool bVar6;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (iVar5 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
    input->buffer_ = puVar2 + 1;
    bVar6 = true;
  }
  else {
    iVar5 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar6 = -1 < iVar5;
  }
  if (bVar6) {
    limit = io::CodedInputStream::PushLimit(input,iVar5);
    while( true ) {
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar5 < 1) break;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar4 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0043d867;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_0043d867:
        uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar6 = -1 < (long)uVar4;
      }
      if (!bVar6) goto LAB_0043d8a6;
      if (values->current_size_ == values->total_size_) {
        RepeatedField<unsigned_int>::Reserve(values,values->total_size_ + 1);
      }
      iVar5 = values->current_size_;
      values->current_size_ = iVar5 + 1;
      values->rep_->elements[iVar5] = (uint)uVar4;
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar6 = true;
  }
  else {
LAB_0043d8a6:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}